

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldConvertors.h
# Opt level: O3

string * __thiscall
FIX::UtcTimeOnlyConvertor::convert_abi_cxx11_
          (string *__return_storage_ptr__,UtcTimeOnlyConvertor *this,UtcTimeOnly *value,
          int precision)

{
  bool bVar1;
  int iVar2;
  string *psVar3;
  byte *pbVar4;
  ulong uVar5;
  uint uVar6;
  byte *pbVar7;
  ulong uVar8;
  uint uVar9;
  byte bVar10;
  long lVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  char result [18];
  undefined8 uStack_60;
  byte local_58 [4];
  undefined1 local_54;
  undefined1 local_53;
  undefined1 local_52;
  undefined1 local_51;
  undefined1 local_50;
  undefined1 local_4f [23];
  string *local_38;
  
  uVar6 = (uint)value;
  uVar9 = 9;
  if (uVar6 < 9) {
    uVar9 = uVar6;
  }
  uVar5 = 0;
  if (-1 < (int)uVar6) {
    uVar5 = (ulong)uVar9;
  }
  uVar14 = *(ulong *)(this + 0x10);
  iVar2 = (int)((long)uVar14 / 1000000000);
  uVar9 = iVar2 / 0xe10;
  iVar13 = (int)uVar5;
  switch(uVar5) {
  case 0:
    break;
  case 1:
    uVar5 = (uVar14 % 1000000000) / 100000000;
    break;
  case 2:
    uVar5 = (uVar14 % 1000000000) / 10000000;
    break;
  case 3:
    uVar5 = (uVar14 % 1000000000) / 1000000;
    break;
  case 4:
    uVar5 = (uVar14 % 1000000000) / 100000;
    break;
  case 5:
    uVar5 = (uVar14 % 1000000000) / 10000;
    break;
  case 6:
    uVar5 = (uVar14 % 1000000000) / 1000;
    break;
  case 7:
    uVar5 = (uVar14 % 1000000000) * 0x28f5c29;
    goto LAB_00276d68;
  case 8:
    uVar5 = (uVar14 % 1000000000) * 0x1999999a;
LAB_00276d68:
    uVar5 = uVar5 >> 0x20;
    break;
  default:
    uVar5 = (ulong)(uint)((int)uVar14 + (int)(uVar14 / 1000000000) * -1000000000);
  }
  pbVar4 = local_58 + 2;
  uVar6 = -uVar9;
  if (0 < (int)uVar9) {
    uVar6 = uVar9;
  }
  uVar9 = uVar6;
  if (99 < uVar6) {
    do {
      uVar6 = uVar9 / 100;
      *(undefined2 *)(pbVar4 + -2) = *(undefined2 *)(digit_pairs + (ulong)(uVar9 % 100) * 2);
      pbVar4 = pbVar4 + -2;
      bVar1 = 9999 < uVar9;
      uVar9 = uVar9 / 100;
    } while (bVar1);
  }
  local_38 = __return_storage_ptr__;
  if (uVar6 < 10) {
    bVar10 = (byte)uVar6 | 0x30;
    lVar11 = -1;
  }
  else {
    pbVar4[-1] = digit_pairs[((ulong)uVar6 * 2 & 0xffffffff) + 1];
    bVar10 = digit_pairs[(ulong)uVar6 * 2];
    lVar11 = -2;
  }
  pbVar7 = pbVar4 + lVar11;
  pbVar4[lVar11] = bVar10;
  if (iVar2 < -0xe0f) {
    pbVar7[-1] = 0x2d;
    pbVar7 = pbVar7 + -1;
  }
  uVar9 = (iVar2 / 0x3c) % 0x3c;
  if (local_58 <= pbVar7 && (long)pbVar7 - (long)local_58 != 0) {
    uStack_60 = 0x276e49;
    memset(local_58,0x30,(long)pbVar7 - (long)local_58);
  }
  local_58[2] = 0x3a;
  uVar6 = -uVar9;
  if (0 < (int)uVar9) {
    uVar6 = uVar9;
  }
  if (9 < uVar6) {
    local_54 = digit_pairs[((ulong)uVar6 * 2 & 0xffffffff) + 1];
    bVar10 = digit_pairs[(ulong)uVar6 * 2];
    lVar11 = 3;
  }
  else {
    bVar10 = (byte)uVar6 | 0x30;
    lVar11 = 4;
  }
  uVar12 = iVar2 % 0x3c;
  local_58[lVar11] = bVar10;
  if ((int)uVar9 < 0) {
    *(undefined1 *)((long)&uStack_60 + lVar11 + 7) = 0x2d;
  }
  else if (uVar6 < 10) {
    uStack_60 = 0x276ead;
    memset(local_58 + 3,0x30,(ulong)(9 >= uVar6));
  }
  local_53 = 0x3a;
  uVar9 = -uVar12;
  if (0 < (int)uVar12) {
    uVar9 = uVar12;
  }
  if (9 < uVar9) {
    local_51 = digit_pairs[((ulong)uVar9 * 2 & 0xffffffff) + 1];
    bVar10 = digit_pairs[(ulong)uVar9 * 2];
    lVar11 = 6;
  }
  else {
    bVar10 = (byte)uVar9 | 0x30;
    lVar11 = 7;
  }
  local_58[lVar11] = bVar10;
  if ((int)uVar12 < 0) {
    *(undefined1 *)((long)&uStack_60 + lVar11 + 7) = 0x2d;
  }
  else if (uVar9 < 10) {
    uStack_60 = 0x276f12;
    memset(&local_52,0x30,(ulong)(9 >= uVar9));
  }
  if (iVar13 == 0) {
    uVar14 = 8;
  }
  else {
    local_50 = 0x2e;
    uVar14 = (ulong)(iVar13 + 9);
    uVar8 = (ulong)(uint)-(int)uVar5;
    if (0 < (int)uVar5) {
      uVar8 = uVar5;
    }
    uVar9 = (uint)uVar8;
    uVar5 = uVar14;
    if (99 < uVar9) {
      do {
        uVar6 = (uint)uVar8;
        uVar9 = (uint)(uVar8 / 100);
        uVar8 = uVar8 / 100;
        *(undefined2 *)((long)&uStack_60 + uVar5 + 6) =
             *(undefined2 *)(digit_pairs + (ulong)(uVar6 + (int)uVar8 * -100) * 2);
        uVar5 = uVar5 - 2;
      } while (9999 < uVar6);
    }
    if (uVar9 < 10) {
      bVar10 = (byte)uVar9 | 0x30;
      lVar11 = -1;
    }
    else {
      *(undefined1 *)((long)&uStack_60 + uVar5 + 7) =
           digit_pairs[((ulong)uVar9 * 2 & 0xffffffff) + 1];
      bVar10 = digit_pairs[(ulong)uVar9 * 2];
      lVar11 = -2;
    }
    lVar11 = lVar11 + uVar5;
    local_58[lVar11] = bVar10;
    if (9 < lVar11) {
      uStack_60 = 0x276fbe;
      memset(local_4f,0x30,lVar11 - 9);
    }
  }
  psVar3 = local_38;
  (local_38->_M_dataplus)._M_p = (pointer)&local_38->field_2;
  uStack_60 = 0x276fdc;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_38,local_58,local_58 + uVar14);
  return psVar3;
}

Assistant:

static std::string convert( const UtcTimeOnly& value,
                              int precision = 0 )
  EXCEPT ( FieldConvertError )
  {
    char result[ 8+10 ]; // Maximum
    int hour, minute, second, fraction;

    precision = clamp_of( precision, 0, 9 );

    value.getHMS( hour, minute, second, fraction, precision );

    integer_to_string_padded ( result, 2, hour );
    result[2] = ':';
    integer_to_string_padded ( result + 3, 2, minute );
    result[5] = ':';
    integer_to_string_padded ( result + 6, 2, second );

    if( precision )
    {
      result[8] = '.';
      integer_to_string_padded ( result + 9, precision, fraction );
    }

    return std::string(result, precision ? (8 + 1 + precision) : 8);
  }